

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

Abc_Obj_t * Abc_NodeRecognizeMux(Abc_Obj_t *pNode,Abc_Obj_t **ppNodeT,Abc_Obj_t **ppNodeE)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  void **ppvVar4;
  int *piVar5;
  int iVar6;
  Abc_Obj_t *pAVar7;
  Abc_Obj_t *pAVar8;
  Abc_Obj_t *pAVar9;
  uint uVar10;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                  ,0x57c,"Abc_Obj_t *Abc_NodeRecognizeMux(Abc_Obj_t *, Abc_Obj_t **, Abc_Obj_t **)")
    ;
  }
  iVar6 = Abc_NodeIsMuxType(pNode);
  if (iVar6 == 0) {
    __assert_fail("Abc_NodeIsMuxType(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                  ,0x57d,"Abc_Obj_t *Abc_NodeRecognizeMux(Abc_Obj_t *, Abc_Obj_t **, Abc_Obj_t **)")
    ;
  }
  piVar3 = (pNode->vFanins).pArray;
  ppvVar4 = pNode->pNtk->vObjs->pArray;
  pAVar9 = (Abc_Obj_t *)ppvVar4[*piVar3];
  pAVar8 = (Abc_Obj_t *)ppvVar4[piVar3[1]];
  piVar3 = (pAVar9->vFanins).pArray;
  iVar6 = *piVar3;
  piVar5 = (pAVar8->vFanins).pArray;
  iVar1 = *piVar5;
  if ((iVar6 == iVar1) &&
     (uVar10 = *(uint *)&pAVar9->field_0x14 >> 10 & 1,
     uVar10 != ((*(uint *)&pAVar8->field_0x14 >> 10 & 1) != 0))) {
    if (uVar10 != 0) {
      pAVar7 = Abc_ObjChild1(pAVar8);
      *ppNodeT = (Abc_Obj_t *)((ulong)pAVar7 ^ 1);
      pAVar9 = Abc_ObjChild1(pAVar9);
LAB_001ea49e:
      *ppNodeE = (Abc_Obj_t *)((ulong)pAVar9 ^ 1);
      pAVar9 = pAVar8;
      goto LAB_001ea4a8;
    }
    pAVar7 = Abc_ObjChild1(pAVar9);
    *ppNodeT = (Abc_Obj_t *)((ulong)pAVar7 ^ 1);
    pAVar8 = Abc_ObjChild1(pAVar8);
  }
  else {
    iVar2 = piVar5[1];
    if ((iVar6 != iVar2) ||
       (uVar10 = *(uint *)&pAVar9->field_0x14 >> 10 & 1,
       uVar10 == ((*(uint *)&pAVar8->field_0x14 >> 0xb & 1) != 0))) {
      iVar6 = piVar3[1];
      if ((iVar6 == iVar1) &&
         (uVar10 = *(uint *)&pAVar9->field_0x14 >> 0xb & 1,
         uVar10 != ((*(uint *)&pAVar8->field_0x14 >> 10 & 1) != 0))) {
        if (uVar10 != 0) {
          pAVar7 = Abc_ObjChild1(pAVar8);
          *ppNodeT = (Abc_Obj_t *)((ulong)pAVar7 ^ 1);
          pAVar9 = Abc_ObjChild0(pAVar9);
          goto LAB_001ea49e;
        }
        pAVar7 = Abc_ObjChild0(pAVar9);
        *ppNodeT = (Abc_Obj_t *)((ulong)pAVar7 ^ 1);
        pAVar8 = Abc_ObjChild1(pAVar8);
      }
      else {
        if ((iVar6 != iVar2) ||
           (uVar10 = *(uint *)&pAVar9->field_0x14 >> 0xb & 1,
           uVar10 == ((*(uint *)&pAVar8->field_0x14 >> 0xb & 1) != 0))) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                        ,0x5c6,
                        "Abc_Obj_t *Abc_NodeRecognizeMux(Abc_Obj_t *, Abc_Obj_t **, Abc_Obj_t **)");
        }
        if (uVar10 != 0) {
          pAVar7 = Abc_ObjChild0(pAVar8);
          *ppNodeT = (Abc_Obj_t *)((ulong)pAVar7 ^ 1);
          pAVar9 = Abc_ObjChild0(pAVar9);
          goto LAB_001ea46c;
        }
        pAVar7 = Abc_ObjChild0(pAVar9);
        *ppNodeT = (Abc_Obj_t *)((ulong)pAVar7 ^ 1);
        pAVar8 = Abc_ObjChild0(pAVar8);
      }
      *ppNodeE = (Abc_Obj_t *)((ulong)pAVar8 ^ 1);
      pAVar8 = pAVar9;
LAB_001ea476:
      pAVar9 = Abc_ObjChild1(pAVar8);
      return pAVar9;
    }
    if (uVar10 != 0) {
      pAVar7 = Abc_ObjChild0(pAVar8);
      *ppNodeT = (Abc_Obj_t *)((ulong)pAVar7 ^ 1);
      pAVar9 = Abc_ObjChild1(pAVar9);
LAB_001ea46c:
      *ppNodeE = (Abc_Obj_t *)((ulong)pAVar9 ^ 1);
      goto LAB_001ea476;
    }
    pAVar7 = Abc_ObjChild1(pAVar9);
    *ppNodeT = (Abc_Obj_t *)((ulong)pAVar7 ^ 1);
    pAVar8 = Abc_ObjChild0(pAVar8);
  }
  *ppNodeE = (Abc_Obj_t *)((ulong)pAVar8 ^ 1);
LAB_001ea4a8:
  pAVar9 = Abc_ObjChild0(pAVar9);
  return pAVar9;
}

Assistant:

Abc_Obj_t * Abc_NodeRecognizeMux( Abc_Obj_t * pNode, Abc_Obj_t ** ppNodeT, Abc_Obj_t ** ppNodeE )
{
    Abc_Obj_t * pNode0, * pNode1;
    assert( !Abc_ObjIsComplement(pNode) );
    assert( Abc_NodeIsMuxType(pNode) );
    // get children
    pNode0 = Abc_ObjFanin0(pNode);
    pNode1 = Abc_ObjFanin1(pNode);
    // find the control variable
//    if ( pNode1->p1 == Fraig_Not(pNode2->p1) )
    if ( Abc_ObjFaninId0(pNode0) == Abc_ObjFaninId0(pNode1) && (Abc_ObjFaninC0(pNode0) ^ Abc_ObjFaninC0(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p1) )
        if ( Abc_ObjFaninC0(pNode0) )
        { // pNode2->p1 is positive phase of C
            *ppNodeT = Abc_ObjNot(Abc_ObjChild1(pNode1));//pNode2->p2);
            *ppNodeE = Abc_ObjNot(Abc_ObjChild1(pNode0));//pNode1->p2);
            return Abc_ObjChild0(pNode1);//pNode2->p1;
        }
        else
        { // pNode1->p1 is positive phase of C
            *ppNodeT = Abc_ObjNot(Abc_ObjChild1(pNode0));//pNode1->p2);
            *ppNodeE = Abc_ObjNot(Abc_ObjChild1(pNode1));//pNode2->p2);
            return Abc_ObjChild0(pNode0);//pNode1->p1;
        }
    }
//    else if ( pNode1->p1 == Fraig_Not(pNode2->p2) )
    else if ( Abc_ObjFaninId0(pNode0) == Abc_ObjFaninId1(pNode1) && (Abc_ObjFaninC0(pNode0) ^ Abc_ObjFaninC1(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p1) )
        if ( Abc_ObjFaninC0(pNode0) )
        { // pNode2->p2 is positive phase of C
            *ppNodeT = Abc_ObjNot(Abc_ObjChild0(pNode1));//pNode2->p1);
            *ppNodeE = Abc_ObjNot(Abc_ObjChild1(pNode0));//pNode1->p2);
            return Abc_ObjChild1(pNode1);//pNode2->p2;
        }
        else
        { // pNode1->p1 is positive phase of C
            *ppNodeT = Abc_ObjNot(Abc_ObjChild1(pNode0));//pNode1->p2);
            *ppNodeE = Abc_ObjNot(Abc_ObjChild0(pNode1));//pNode2->p1);
            return Abc_ObjChild0(pNode0);//pNode1->p1;
        }
    }
//    else if ( pNode1->p2 == Fraig_Not(pNode2->p1) )
    else if ( Abc_ObjFaninId1(pNode0) == Abc_ObjFaninId0(pNode1) && (Abc_ObjFaninC1(pNode0) ^ Abc_ObjFaninC0(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p2) )
        if ( Abc_ObjFaninC1(pNode0) )
        { // pNode2->p1 is positive phase of C
            *ppNodeT = Abc_ObjNot(Abc_ObjChild1(pNode1));//pNode2->p2);
            *ppNodeE = Abc_ObjNot(Abc_ObjChild0(pNode0));//pNode1->p1);
            return Abc_ObjChild0(pNode1);//pNode2->p1;
        }
        else
        { // pNode1->p2 is positive phase of C
            *ppNodeT = Abc_ObjNot(Abc_ObjChild0(pNode0));//pNode1->p1);
            *ppNodeE = Abc_ObjNot(Abc_ObjChild1(pNode1));//pNode2->p2);
            return Abc_ObjChild1(pNode0);//pNode1->p2;
        }
    }
//    else if ( pNode1->p2 == Fraig_Not(pNode2->p2) )
    else if ( Abc_ObjFaninId1(pNode0) == Abc_ObjFaninId1(pNode1) && (Abc_ObjFaninC1(pNode0) ^ Abc_ObjFaninC1(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p2) )
        if ( Abc_ObjFaninC1(pNode0) )
        { // pNode2->p2 is positive phase of C
            *ppNodeT = Abc_ObjNot(Abc_ObjChild0(pNode1));//pNode2->p1);
            *ppNodeE = Abc_ObjNot(Abc_ObjChild0(pNode0));//pNode1->p1);
            return Abc_ObjChild1(pNode1);//pNode2->p2;
        }
        else
        { // pNode1->p2 is positive phase of C
            *ppNodeT = Abc_ObjNot(Abc_ObjChild0(pNode0));//pNode1->p1);
            *ppNodeE = Abc_ObjNot(Abc_ObjChild0(pNode1));//pNode2->p1);
            return Abc_ObjChild1(pNode0);//pNode1->p2;
        }
    }
    assert( 0 ); // this is not MUX
    return NULL;
}